

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O0

wchar_t prompt_get(EditLine *el,el_pfunc_t *prf,wchar_t *c,wchar_t op)

{
  el_prompt_t *local_38;
  el_prompt_t *p;
  wchar_t op_local;
  wchar_t *c_local;
  el_pfunc_t *prf_local;
  EditLine *el_local;
  
  if (prf == (el_pfunc_t *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    if (op == L'\0') {
      local_38 = &el->el_prompt;
    }
    else {
      local_38 = &el->el_rprompt;
    }
    if (prf != (el_pfunc_t *)0x0) {
      *prf = local_38->p_func;
    }
    if (c != (wchar_t *)0x0) {
      *c = local_38->p_ignore;
    }
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
prompt_get(EditLine *el, el_pfunc_t *prf, wchar_t *c, int op)
{
	el_prompt_t *p;

	if (prf == NULL)
		return -1;

	if (op == EL_PROMPT)
		p = &el->el_prompt;
	else
		p = &el->el_rprompt;

	if (prf)
		*prf = p->p_func;
	if (c)
		*c = p->p_ignore;

	return 0;
}